

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void __thiscall asl::Random::seed(Random *this,ULong s)

{
  int local_20;
  int local_1c;
  int i_1;
  int i;
  ULong s_local;
  Random *this_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    this->_state[local_1c] =
         s ^ 0x7a12345fb678ce93 ^ (s ^ 0x7a12345fb678ce93) << ((char)local_1c + 2U & 0x3f);
  }
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    get(this);
  }
  return;
}

Assistant:

void Random::seed(ULong s)
{
	s ^= 0x7a12345fb678ce93ull;
	for (int i = 0; i < _size; i++)
		_state[i] = s ^ (s << (i + 2));

	for (int i = 0; i < 6; i++)
		get();
}